

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BvhNode.cpp
# Opt level: O2

void __thiscall
BVH_Node::BVH_Node(BVH_Node *this,Object **list,int size,float t_start,float t_end,bool is_root)

{
  int iVar1;
  BVH_Node *pBVar2;
  Object *pOVar3;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  AABB _aabb_right;
  AABB _aabb_left;
  
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__BVH_Node_0011aa38;
  this->m_is_root = is_root;
  if (size == 2) {
    pOVar3 = *list;
    this->m_node_left = pOVar3;
    this->m_node_right = list[1];
LAB_00106cae:
    this->m_is_leaf = true;
  }
  else {
    if (size == 1) {
      pOVar3 = *list;
      this->m_node_right = pOVar3;
      this->m_node_left = pOVar3;
      goto LAB_00106cae;
    }
    iVar1 = size / 2;
    pBVar2 = (BVH_Node *)operator_new(0x38);
    BVH_Node(pBVar2,list,iVar1,t_start,t_end,false);
    this->m_node_left = (Object *)pBVar2;
    pBVar2 = (BVH_Node *)operator_new(0x38);
    BVH_Node(pBVar2,list + iVar1,size - iVar1,t_start,t_end,false);
    this->m_node_right = (Object *)pBVar2;
    this->m_is_leaf = false;
    pOVar3 = this->m_node_left;
  }
  iVar1 = (*pOVar3->_vptr_Object[3])(t_start,t_end,pOVar3,&_aabb_left);
  if ((char)iVar1 != '\0') {
    iVar1 = (*this->m_node_right->_vptr_Object[3])(t_start,t_end,this->m_node_right,&_aabb_right);
    if ((char)iVar1 != '\0') goto LAB_00106d6c;
  }
  std::operator<<((ostream *)&std::cerr,"Bounding Box Creation Error\n");
LAB_00106d6c:
  AABB::Merge(&_aabb_left,&_aabb_right);
  *(undefined8 *)((this->m_aabb).m_max.e + 1) = local_60;
  *(undefined8 *)(this->m_aabb).m_min.e = local_70;
  *(undefined8 *)((this->m_aabb).m_min.e + 2) = uStack_68;
  return;
}

Assistant:

BVH_Node::BVH_Node(Object **list, int size, float t_start, float t_end, bool is_root)
{
    m_is_root = is_root;

    if(size == 1) {
        m_node_left = m_node_right = list[0];
        m_is_leaf   = true;
    } 
    else if(size == 2) {
        m_node_left  = list[0];
        m_node_right = list[1];
        m_is_leaf    = true;
    }
    else {
        int _div_size_2 = size/2;
        m_node_left  = new BVH_Node(list              ,        _div_size_2, t_start, t_end);
        m_node_right = new BVH_Node(list + _div_size_2, size - _div_size_2, t_start, t_end);
        m_is_leaf    = false;
    }

    AABB _aabb_left, _aabb_right;
    if(!m_node_left->CreateBoundingBox (t_start, t_end, _aabb_left ) ||
       !m_node_right->CreateBoundingBox(t_start, t_end, _aabb_right)) {
           std::cerr << "Bounding Box Creation Error\n";
    }

    m_aabb = AABB::Merge(_aabb_left, _aabb_right);
}